

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O3

void player_take_terrain_damage(player *p,loc_conflict grid)

{
  int iVar1;
  _Bool _Var2;
  wchar_t cperc;
  wchar_t wVar3;
  feature *pfVar4;
  wchar_t wVar5;
  char dam_text [32];
  char local_48 [32];
  
  cperc = player_check_terrain_damage(p,grid,true);
  if (cperc != L'\0') {
    if ((L'⌧' < cperc) || (wVar5 = L'\0', p->timed[0xc] == 0)) {
      wVar5 = (p->state).dam_red;
      wVar3 = cperc - wVar5;
      if ((wVar3 != L'\0' && wVar5 <= cperc) && (wVar5 = (p->state).perc_dam_red, wVar5 != L'\0')) {
        iVar1 = (int)((ulong)((long)(wVar5 * wVar3) * -0x51eb851f) >> 0x20);
        wVar3 = ((iVar1 >> 5) - (iVar1 >> 0x1f)) + wVar3;
      }
      wVar5 = L'\0';
      if (L'\0' < wVar3) {
        wVar5 = wVar3;
      }
    }
    _Var2 = square_isfiery(cave,(loc)grid);
    if (_Var2) {
      local_48[0x10] = '\0';
      local_48[0x11] = '\0';
      local_48[0x12] = '\0';
      local_48[0x13] = '\0';
      local_48[0x14] = '\0';
      local_48[0x15] = '\0';
      local_48[0x16] = '\0';
      local_48[0x17] = '\0';
      local_48[0x18] = '\0';
      local_48[0x19] = '\0';
      local_48[0x1a] = '\0';
      local_48[0x1b] = '\0';
      local_48[0x1c] = '\0';
      local_48[0x1d] = '\0';
      local_48[0x1e] = '\0';
      local_48[0x1f] = '\0';
      local_48[0] = '\0';
      local_48[1] = '\0';
      local_48[2] = '\0';
      local_48[3] = '\0';
      local_48[4] = '\0';
      local_48[5] = '\0';
      local_48[6] = '\0';
      local_48[7] = '\0';
      local_48[8] = '\0';
      local_48[9] = '\0';
      local_48[10] = '\0';
      local_48[0xb] = '\0';
      local_48[0xc] = '\0';
      local_48[0xd] = '\0';
      local_48[0xe] = '\0';
      local_48[0xf] = '\0';
      if ((wVar5 != L'\0') && ((p->opts).opt[3] == true)) {
        strnfmt(local_48,0x20," (%d)",(ulong)(uint)wVar5);
      }
      pfVar4 = square_feat(cave,(loc)grid);
      msg("%s%s",pfVar4->hurt_msg,local_48);
      inven_damage(p,L'\x02',cperc);
    }
    pfVar4 = square_feat(cave,(loc)grid);
    take_hit(p,wVar5,pfVar4->die_msg);
  }
  return;
}

Assistant:

void player_take_terrain_damage(struct player *p, struct loc grid)
{
	int dam_taken = player_check_terrain_damage(p, grid, true);
	int dam_reduced;

	if (!dam_taken) {
		return;
	}

	/*
	 * Damage the player and inventory; inventory damage is based on
	 * the raw incoming damage and not the value accounting for the
	 * player's damage reduction.
	 */
	dam_reduced = player_apply_damage_reduction(p, dam_taken);
	if (square_isfiery(cave, grid)) {
		char dam_text[32] = "";

		if (dam_reduced > 0 && OPT(p, show_damage)) {
			strnfmt(dam_text, sizeof(dam_text), " (%d)",
				dam_reduced);
		}
		msg("%s%s", square_feat(cave, grid)->hurt_msg, dam_text);
		inven_damage(p, PROJ_FIRE, dam_taken);
	}
	take_hit(p, dam_reduced, square_feat(cave, grid)->die_msg);
}